

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_database.cc
# Opt level: O0

bool __thiscall
google::protobuf::anon_unknown_23::ValidateSymbolName(anon_unknown_23 *this,string_view name)

{
  char cVar1;
  const_iterator pvVar2;
  char c;
  const_iterator __end2;
  const_iterator __begin2;
  string_view *__range2;
  string_view name_local;
  
  name_local._M_len = name._M_len;
  __range2 = (string_view *)this;
  __end2 = std::basic_string_view<char,_std::char_traits<char>_>::begin
                     ((basic_string_view<char,_std::char_traits<char>_> *)&__range2);
  pvVar2 = std::basic_string_view<char,_std::char_traits<char>_>::end
                     ((basic_string_view<char,_std::char_traits<char>_> *)&__range2);
  while( true ) {
    if (__end2 == pvVar2) {
      return true;
    }
    cVar1 = *__end2;
    if (((((cVar1 != '.') && (cVar1 != '_')) && ((cVar1 < '0' || ('9' < cVar1)))) &&
        ((cVar1 < 'A' || ('Z' < cVar1)))) && ((cVar1 < 'a' || ('z' < cVar1)))) break;
    __end2 = __end2 + 1;
  }
  return false;
}

Assistant:

bool ValidateSymbolName(absl::string_view name) {
  for (char c : name) {
    // I don't trust ctype.h due to locales.  :(
    if (c != '.' && c != '_' && (c < '0' || c > '9') && (c < 'A' || c > 'Z') &&
        (c < 'a' || c > 'z')) {
      return false;
    }
  }
  return true;
}